

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  undefined8 *puVar1;
  ZSTD_Sequence *pZVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  undefined8 *puVar5;
  BYTE **ppBVar6;
  uint uVar7;
  uint uVar8;
  ZSTD_CDict *pZVar9;
  ZSTD_compressedBlockState_t *pZVar10;
  BYTE *pBVar11;
  undefined8 uVar12;
  ulong uVar13;
  seqDef *psVar14;
  uint uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint *puVar23;
  int iVar24;
  undefined8 *puVar25;
  ulong uVar26;
  undefined8 local_60;
  uint local_58 [2];
  ulong local_50;
  size_t local_48;
  undefined8 *local_40;
  ZSTD_Sequence *local_38;
  
  local_40 = (undefined8 *)(blockSize + (long)src);
  pZVar9 = cctx->cdict;
  if (pZVar9 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_50 = 0;
      goto LAB_00695993;
    }
    pZVar9 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_50 = (ulong)(uint)pZVar9->dictContentSize;
LAB_00695993:
  uVar18 = seqPos->idx;
  pZVar10 = (cctx->blockState).prevCBlock;
  local_58[0] = pZVar10->rep[2];
  local_60 = *(ulong *)pZVar10->rep;
  puVar1 = local_40 + -4;
  do {
    uVar16 = (ulong)uVar18;
    pZVar2 = inSeqs + uVar16;
    uVar7 = inSeqs[uVar16].matchLength;
    if (uVar7 == 0) {
      if ((inSeqsSize <= uVar16) || (uVar15 = pZVar2->offset, uVar15 == 0)) goto LAB_00695ccb;
    }
    else {
      if (inSeqsSize <= uVar16) {
LAB_00695ccb:
        pZVar10 = (cctx->blockState).nextCBlock;
        pZVar10->rep[2] = local_58[0];
        *(ulong *)pZVar10->rep = local_60;
        uVar16 = (ulong)pZVar2->litLength;
        if (uVar16 != 0) {
          local_48 = inSeqsSize;
          local_38 = inSeqs;
          memcpy((cctx->seqStore).lit,src,uVar16);
          ppBVar6 = &(cctx->seqStore).lit;
          *ppBVar6 = *ppBVar6 + uVar16;
          src = (void *)((long)src + (ulong)pZVar2->litLength);
          seqPos->posInSrc = seqPos->posInSrc + (ulong)pZVar2->litLength;
        }
        if ((undefined8 *)src != local_40) {
          return 0xffffffffffffffec;
        }
        seqPos->idx = uVar18 + 1;
        return 0;
      }
      uVar15 = pZVar2->offset;
    }
    uVar16 = (ulong)uVar15;
    uVar8 = pZVar2->litLength;
    uVar26 = (ulong)uVar8;
    uVar13 = local_60 & 0xffffffff;
    uVar19 = 0;
    uVar22 = (uint)(uVar26 == 0);
    if ((uint)local_60 == uVar15 && uVar26 != 0) {
LAB_00695a4a:
      uVar22 = uVar22 + uVar19;
      if (uVar22 == 0) {
        uVar13 = local_60 >> 0x20;
        puVar23 = local_58;
        uVar16 = local_60;
      }
      else {
        if (uVar22 == 3) {
          uVar15 = (uint)local_60 - 1;
        }
        else {
          uVar15 = local_58[(ulong)uVar22 - 2];
        }
        uVar13 = local_60 & 0xffffffff;
        uVar16 = (ulong)uVar15;
        puVar23 = (uint *)((long)&local_60 + 4);
        if (uVar22 == 1) {
          puVar23 = local_58;
        }
      }
    }
    else {
      iVar24 = 2;
      if ((local_60._4_4_ == uVar15) || (iVar24 = 3, local_58[0] == uVar15)) {
        uVar19 = ~uVar22 + iVar24;
        goto LAB_00695a4a;
      }
      uVar19 = 2;
      if (((uint)local_60 - 1 == uVar15 && uVar8 == 0) || (uVar19 = uVar15 + 2, uVar19 < 3))
      goto LAB_00695a4a;
      puVar23 = (uint *)((long)&local_60 + 4);
    }
    local_58[0] = *puVar23;
    local_60 = uVar16 & 0xffffffff | uVar13 << 0x20;
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar13 = (ulong)(uVar7 + uVar8) + seqPos->posInSrc;
      seqPos->posInSrc = uVar13;
      uVar20 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar16 = local_50 + uVar13;
      if (uVar20 < uVar13) {
        uVar16 = uVar20;
      }
      if (uVar7 < (cctx->appliedParams).cParams.minMatch) {
        return 0xffffffffffffffec;
      }
      if (uVar16 + 2 < (ulong)uVar19) {
        return 0xffffffffffffffec;
      }
    }
    if ((cctx->seqStore).maxNbSeq < (ulong)(uVar18 - seqPos->idx)) {
      return 0xffffffffffffffc0;
    }
    puVar3 = (undefined8 *)((long)src + uVar26);
    pBVar11 = (cctx->seqStore).lit;
    if (puVar1 < puVar3) {
      pBVar17 = pBVar11;
      puVar25 = (undefined8 *)src;
      if (src <= puVar1) {
        pBVar17 = pBVar11 + ((long)puVar1 - (long)src);
        uVar12 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar11 = *src;
        *(undefined8 *)(pBVar11 + 8) = uVar12;
        puVar25 = puVar1;
        if (0x10 < (long)puVar1 - (long)src) {
          lVar21 = 0x10;
          do {
            uVar12 = ((undefined8 *)((long)src + lVar21))[1];
            pBVar4 = pBVar11 + lVar21;
            *(undefined8 *)pBVar4 = *(undefined8 *)((long)src + lVar21);
            *(undefined8 *)(pBVar4 + 8) = uVar12;
            puVar5 = (undefined8 *)((long)src + lVar21 + 0x10);
            uVar12 = puVar5[1];
            *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
            *(undefined8 *)(pBVar4 + 0x18) = uVar12;
            lVar21 = lVar21 + 0x20;
          } while (pBVar4 + 0x20 < pBVar17);
        }
      }
      if (puVar25 < puVar3) {
        lVar21 = 0;
        do {
          pBVar17[lVar21] = *(BYTE *)((long)puVar25 + lVar21);
          lVar21 = lVar21 + 1;
        } while ((long)puVar3 - (long)puVar25 != lVar21);
      }
LAB_00695c3a:
      ppBVar6 = &(cctx->seqStore).lit;
      *ppBVar6 = *ppBVar6 + uVar26;
      psVar14 = (cctx->seqStore).sequences;
      if (0xffff < uVar8) {
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
    }
    else {
      uVar12 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar11 = *src;
      *(undefined8 *)(pBVar11 + 8) = uVar12;
      if (0x10 < uVar8) {
        pBVar11 = (cctx->seqStore).lit;
        uVar12 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar11 + 0x18) = uVar12;
        if (0x10 < uVar26 - 0x10) {
          lVar21 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar21 + 0x20);
            uVar12 = puVar3[1];
            pBVar17 = pBVar11 + lVar21 + 0x20;
            *(undefined8 *)pBVar17 = *puVar3;
            *(undefined8 *)(pBVar17 + 8) = uVar12;
            puVar3 = (undefined8 *)((long)src + lVar21 + 0x30);
            uVar12 = puVar3[1];
            *(undefined8 *)(pBVar17 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar17 + 0x18) = uVar12;
            lVar21 = lVar21 + 0x20;
          } while (pBVar17 + 0x20 < pBVar11 + uVar26);
          goto LAB_00695c3a;
        }
      }
      ppBVar6 = &(cctx->seqStore).lit;
      *ppBVar6 = *ppBVar6 + uVar26;
      psVar14 = (cctx->seqStore).sequences;
    }
    psVar14->litLength = (U16)uVar8;
    psVar14->offset = uVar19 + 1;
    if (0xffff < uVar7 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar14 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    psVar14->matchLength = (U16)(uVar7 - 3);
    (cctx->seqStore).sequences = psVar14 + 1;
    src = (void *)((long)src + (ulong)(uVar8 + uVar7));
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                             const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                             const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;
    U32 litLength;
    U32 matchLength;
    U32 ll0;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0) && idx < inSeqsSize; ++idx) {
        litLength = inSeqs[idx].litLength;
        matchLength = inSeqs[idx].matchLength;
        ll0 = litLength == 0;
        offCode = ZSTD_finalizeOffCode(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize,
                                                cctx->appliedParams.cParams.minMatch),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, corruption_detected, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}